

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O3

void longjmp_into_runtime(__cilkrts_worker *w,scheduling_stack_fcn_t fcn,__cilkrts_stack_frame *sf)

{
  local_state *plVar1;
  full_frame *ff;
  __cilkrts_stack_frame *sf_00;
  cilk_fiber_data *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  cilk_fiber *fiber;
  
  plVar1 = w->l;
  if (plVar1->post_suspend == (scheduling_stack_fcn_t)0x0) {
    if (w->g->P == 1) {
      (*fcn)(w,plVar1->frame_ff,sf);
      ff = w->l->next_frame_ff;
      if (ff != (full_frame *)0x0) {
        w->l->next_frame_ff = (full_frame *)0x0;
      }
      setup_for_execution(w,ff,0);
      sf_00 = w->current_stack_frame;
      sf_00->worker = w;
      cilkrts_resume(sf_00,ff);
    }
    plVar1->post_suspend = fcn;
    plVar1->suspended_stack = sf;
    fiber = plVar1->fiber_to_free;
    if (fiber == (cilk_fiber *)0x0) {
      fiber = plVar1->frame_ff->parent->fiber_child;
    }
    pcVar2 = cilk_fiber_get_data(fiber);
    plVar1 = w->l;
    if (plVar1->frame_ff->fiber_self == (cilk_fiber *)0x0) {
      pcVar2->resume_sf = (__cilkrts_stack_frame *)0x0;
      if (pcVar2->owner == w) {
        cilk_fiber_set_post_switch_proc(plVar1->scheduling_fiber,enter_runtime_transition_proc);
        cilk_fiber_invoke_tbb_stack_op(fiber,CILK_TBB_STACK_ORPHAN);
        plVar1 = w->l;
        if (plVar1->fiber_to_free == (cilk_fiber *)0x0) {
          cilk_fiber_suspend_self_and_resume_other(fiber,plVar1->scheduling_fiber);
          user_code_resume_after_switch_into_runtime(fiber);
        }
        plVar1->fiber_to_free = (cilk_fiber *)0x0;
        pcVar2 = cilk_fiber_get_data(plVar1->scheduling_fiber);
        if (pcVar2->owner == (__cilkrts_worker *)0x0) {
          cilk_fiber_invoke_tbb_stack_op(fiber,CILK_TBB_STACK_RELEASE);
          cilk_fiber_remove_reference_from_self_and_resume_other
                    (fiber,&w->l->fiber_pool,w->l->scheduling_fiber);
        }
        pcVar3 = "NULL == cilk_fiber_get_data(w->l->scheduling_fiber)->owner";
        uVar4 = 0x685;
      }
      else {
        pcVar3 = "fdata->owner == w";
        uVar4 = 0x676;
      }
    }
    else {
      pcVar3 = "NULL == w->l->frame_ff->fiber_self";
      uVar4 = 0x66f;
    }
  }
  else {
    pcVar3 = "!w->l->post_suspend";
    uVar4 = 0x63c;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                ,uVar4,pcVar3);
}

Assistant:

static NORETURN
longjmp_into_runtime(__cilkrts_worker *w,
                     scheduling_stack_fcn_t fcn,
                     __cilkrts_stack_frame *sf)
{
    full_frame *ff, *ff2;

    CILK_ASSERT(!w->l->post_suspend);
    ff = w->l->frame_ff;

    // If we've got only one worker, stealing shouldn't be possible.
    // Assume that this is a steal or return from spawn in a force-reduce case.
    // We don't have a scheduling stack to switch to, so call the continuation
    // function directly.
    if (1 == w->g->P) {
        fcn(w, ff, sf);

        /* The call to function c() will have pushed ff as the next frame.  If
         * this were a normal (non-forced-reduce) execution, there would have
         * been a pop_next_frame call in a separate part of the runtime.  We
         * must call pop_next_frame here to complete the push/pop cycle. */
        ff2 = pop_next_frame(w);

        setup_for_execution(w, ff2, 0);
        scheduling_fiber_prepare_to_resume_user_code(w, ff2, w->current_stack_frame);
        cilkrts_resume(w->current_stack_frame, ff2);
        
// Suppress clang warning that the expression result is unused
#if defined(__clang__) && (! defined(__INTEL_COMPILER))
#   pragma clang diagnostic push
#   pragma clang diagnostic ignored "-Wunused-value"
#endif // __clang__
        /* no return */
        CILK_ASSERT(((void)"returned from __cilkrts_resume", 0));
#if defined(__clang__) && (! defined(__INTEL_COMPILER))
#   pragma clang diagnostic pop
#endif // __clang__
    }

    w->l->post_suspend = fcn;
    w->l->suspended_stack = sf;

    ITT_SYNC_RELEASING(w);
    ITT_SYNC_PREPARE(w);

#if FIBER_DEBUG >= 2
    fprintf(stderr, "ThreadId=%p, W=%d: about to switch into runtime... w->l->frame_ff = %p, sf=%p\n",
            cilkos_get_current_thread_id(),
            w->self, w->l->frame_ff,
            sf);
#endif

    // Current fiber is either the (1) one we are about to free,
    // or (2) it has been passed up to the parent.
    cilk_fiber *current_fiber = ( w->l->fiber_to_free ?
                                  w->l->fiber_to_free :
                                  w->l->frame_ff->parent->fiber_child );
    cilk_fiber_data* fdata = cilk_fiber_get_data(current_fiber);
    CILK_ASSERT(NULL == w->l->frame_ff->fiber_self);

    // Clear the sf in the current fiber for cleanliness, to prevent
    // us from accidentally resuming a bad sf.
    // Technically, resume_sf gets overwritten for a fiber when
    // we are about to resume it anyway.
    fdata->resume_sf = NULL;
    CILK_ASSERT(fdata->owner == w);

    // Set the function to execute immediately after switching to the
    // scheduling fiber, but before freeing any fibers.
    cilk_fiber_set_post_switch_proc(w->l->scheduling_fiber,
                                    enter_runtime_transition_proc);
    cilk_fiber_invoke_tbb_stack_op(current_fiber, CILK_TBB_STACK_ORPHAN);
    
    if (w->l->fiber_to_free) {
        // Case 1: we are freeing this fiber.  We never
        // resume this fiber again after jumping into the runtime.
        w->l->fiber_to_free = NULL;

        // Extra check. Normally, the fiber we are about to switch to
        // should have a NULL owner.
        CILK_ASSERT(NULL == cilk_fiber_get_data(w->l->scheduling_fiber)->owner);
#if FIBER_DEBUG >= 4
        fprintf(stderr, "ThreadId=%p, W=%d: about to switch into runtime.. current_fiber = %p, deallcoate, switch to fiber %p\n",
                cilkos_get_current_thread_id(),
                w->self,
                current_fiber, w->l->scheduling_fiber);
#endif
        cilk_fiber_invoke_tbb_stack_op(current_fiber, CILK_TBB_STACK_RELEASE);
        NOTE_INTERVAL(w, INTERVAL_DEALLOCATE_RESUME_OTHER);
        cilk_fiber_remove_reference_from_self_and_resume_other(current_fiber,
                                                               &w->l->fiber_pool,
                                                               w->l->scheduling_fiber);
        // We should never come back here!
        CILK_ASSERT(0);
    }
    else {        
        // Case 2: We are passing the fiber to our parent because we
        // are leftmost.  We should come back later to
        // resume execution of user code.
        //
        // If we are not freeing a fiber, there we must be
        // returning from a spawn or processing an exception.  The
        // "sync" path always frees a fiber.
        // 
        // We must be the leftmost child, and by left holder logic, we
        // have already moved the current fiber into our parent full
        // frame.
#if FIBER_DEBUG >= 2
        fprintf(stderr, "ThreadId=%p, W=%d: about to suspend self into runtime.. current_fiber = %p, deallcoate, switch to fiber %p\n",
                cilkos_get_current_thread_id(),
                w->self,
                current_fiber, w->l->scheduling_fiber);
#endif

        NOTE_INTERVAL(w, INTERVAL_SUSPEND_RESUME_OTHER);

        cilk_fiber_suspend_self_and_resume_other(current_fiber,
                                                 w->l->scheduling_fiber);
        // Resuming this fiber returns control back to
        // this function because our implementation uses OS fibers.
        //
        // On Unix, we could have the choice of passing the
        // user_code_resume_after_switch_into_runtime as an extra "resume_proc"
        // that resumes execution of user code instead of the
        // jumping back here, and then jumping back to user code.
#if FIBER_DEBUG >= 2
        CILK_ASSERT(fdata->owner == __cilkrts_get_tls_worker());
#endif
        user_code_resume_after_switch_into_runtime(current_fiber);
    }
}